

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

void compute_ideal_colors_and_weights_1plane
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei)

{
  vfloat4 *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  uint8_t (*pauVar13) [216];
  ulong uVar14;
  uint j;
  ulong uVar15;
  uint i;
  ulong uVar16;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  partition_metrics pms [4];
  float fVar17;
  float fVar19;
  
  auVar18 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                       *(undefined1 (*) [16])(blk->data_min).m,0);
  auVar18 = vblendps_avx(ZEXT816(0) << 0x40,auVar18,8);
  if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar18[0xf] < '\0') {
    compute_ideal_colors_and_weights_3_comp(blk,pi,ei,3);
    return;
  }
  bVar3 = blk->texel_count;
  uVar16 = (ulong)bVar3;
  if (uVar16 != 0) {
    uVar6 = pi->partition_count;
    if ((ulong)uVar6 == 0) {
      __assert_fail("partition_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                    ,0x213,
                    "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
                   );
    }
    uVar2 = *(undefined8 *)((blk->channel_weight).m + 2);
    fVar17 = (float)uVar2;
    auVar18._0_4_ = fVar17 + (blk->channel_weight).m[0];
    fVar19 = (float)((ulong)uVar2 >> 0x20);
    auVar18._4_4_ = fVar19 + (blk->channel_weight).m[1];
    auVar18._8_4_ = fVar17 + (blk->channel_weight).m[2];
    auVar18._12_4_ = fVar19 + (blk->channel_weight).m[3];
    auVar18 = vhaddps_avx(auVar18,auVar18);
    compute_avgs_and_dirs_4_comp(pi,blk,pms);
    pauVar13 = pi->texels_of_partition;
    bVar12 = true;
    uVar14 = 0;
    auVar20._8_4_ = 0x3f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._12_4_ = 0x3f000000;
    auVar23._8_4_ = 0x3f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._12_4_ = 0x3f800000;
    fVar17 = 0.0;
    do {
      if (uVar14 == uVar6) {
        for (; uVar16 < (bVar3 + 7 & 0xfffffff8); uVar16 = uVar16 + 1) {
          ei->weights[uVar16] = 0.0;
          ei->weight_error_scale[uVar16] = 0.0;
        }
        ei->is_constant_weight_error_scale = bVar12;
        return;
      }
      auVar27 = *(undefined1 (*) [16])pms[uVar14].dir.m;
      auVar29 = vhaddps_avx(auVar27,auVar27);
      if (auVar29._0_4_ + pms[uVar14].dir.m[2] < 0.0) {
        auVar27 = vsubps_avx(ZEXT816(0) << 0x40,auVar27);
      }
      auVar22._0_4_ = auVar27._0_4_ * auVar27._0_4_;
      auVar22._4_4_ = auVar27._4_4_ * auVar27._4_4_;
      auVar22._8_4_ = auVar27._8_4_ * auVar27._8_4_;
      auVar22._12_4_ = auVar27._12_4_ * auVar27._12_4_;
      auVar29 = vshufpd_avx(auVar22,auVar22,1);
      auVar21._0_4_ = auVar22._0_4_ + auVar29._0_4_;
      auVar21._4_4_ = auVar22._4_4_ + auVar29._4_4_;
      auVar21._8_4_ = auVar22._8_4_ + auVar29._8_4_;
      auVar21._12_4_ = auVar22._12_4_ + auVar29._12_4_;
      auVar29 = vhaddps_avx(auVar21,auVar21);
      fVar19 = auVar29._0_4_;
      auVar29._4_4_ = fVar19;
      auVar29._0_4_ = fVar19;
      auVar29._8_4_ = fVar19;
      auVar29._12_4_ = fVar19;
      auVar29 = vsqrtps_avx(auVar29);
      auVar27 = vdivps_avx(auVar27,auVar29);
      if ((fVar19 == 0.0) && (!NAN(fVar19))) {
        auVar27 = auVar20;
      }
      auVar29 = *(undefined1 (*) [16])pms[uVar14].avg.m;
      bVar4 = pi->partition_texel_count[uVar14];
      uVar15 = 0;
      auVar22 = SUB6416(ZEXT464(0xd01502f9),0);
      auVar21 = SUB6416(ZEXT464(0x501502f9),0);
      while( true ) {
        fVar24 = auVar27._4_4_;
        fVar25 = auVar27._8_4_;
        fVar26 = auVar27._12_4_;
        fVar19 = auVar27._0_4_;
        if (bVar4 == uVar15) break;
        bVar5 = (*pauVar13)[uVar15];
        auVar8 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar5]),ZEXT416((uint)blk->data_g[bVar5]),
                               0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)blk->data_b[bVar5]),0x20);
        auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)blk->data_a[bVar5]),0x30);
        auVar8 = vsubps_avx(auVar8,auVar29);
        auVar30._0_4_ = fVar19 * auVar8._0_4_;
        auVar30._4_4_ = fVar24 * auVar8._4_4_;
        auVar30._8_4_ = fVar25 * auVar8._8_4_;
        auVar30._12_4_ = fVar26 * auVar8._12_4_;
        auVar8 = vshufpd_avx(auVar30,auVar30,1);
        auVar31._0_4_ = auVar30._0_4_ + auVar8._0_4_;
        auVar31._4_4_ = auVar30._4_4_ + auVar8._4_4_;
        auVar31._8_4_ = auVar30._8_4_ + auVar8._8_4_;
        auVar31._12_4_ = auVar30._12_4_ + auVar8._12_4_;
        auVar8 = vhaddps_avx(auVar31,auVar31);
        ei->weights[bVar5] = auVar8._0_4_;
        auVar21 = vminss_avx(auVar8,auVar21);
        auVar22 = vmaxss_avx(auVar8,auVar22);
        uVar15 = uVar15 + 1;
      }
      auVar27 = auVar21;
      if (auVar22._0_4_ <= auVar21._0_4_) {
        auVar27 = ZEXT816(0) << 0x20;
      }
      auVar21 = vcmpss_avx(auVar22,auVar21,6);
      auVar22 = vblendvps_avx(SUB6416(ZEXT464(0x33d6bf95),0),auVar22,auVar21);
      fVar28 = auVar27._0_4_;
      fVar32 = auVar22._0_4_;
      fVar10 = fVar32 - fVar28;
      fVar9 = fVar10 * fVar10;
      bVar7 = fVar9 == fVar17;
      fVar11 = fVar9;
      if (uVar14 != 0) {
        fVar11 = fVar17;
      }
      fVar17 = fVar11;
      if (uVar14 != 0) {
        bVar12 = (bool)(bVar7 & bVar12);
      }
      pvVar1 = (ei->ep).endpt0 + uVar14;
      pvVar1->m[0] = auVar29._0_4_ + fVar19 * fVar28;
      pvVar1->m[1] = auVar29._4_4_ + fVar24 * fVar28;
      pvVar1->m[2] = auVar29._8_4_ + fVar25 * fVar28;
      pvVar1->m[3] = auVar29._12_4_ + fVar26 * fVar28;
      pvVar1 = (ei->ep).endpt1 + uVar14;
      pvVar1->m[0] = auVar29._0_4_ + fVar19 * fVar32;
      pvVar1->m[1] = auVar29._4_4_ + fVar24 * fVar32;
      pvVar1->m[2] = auVar29._8_4_ + fVar25 * fVar32;
      pvVar1->m[3] = auVar29._12_4_ + fVar26 * fVar32;
      fVar9 = fVar9 * auVar18._0_4_ * 0.25;
      uVar15 = 0;
      while (bVar4 != uVar15) {
        bVar5 = (*pauVar13)[uVar15];
        auVar27 = ZEXT416((uint)((1.0 / fVar10) * (ei->weights[bVar5] - fVar28)));
        auVar29 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
        auVar27 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar27,1);
        auVar27 = vblendvps_avx(auVar29,auVar23,auVar27);
        uVar15 = uVar15 + 1;
        ei->weights[bVar5] = auVar27._0_4_;
        ei->weight_error_scale[bVar5] = fVar9;
        if (NAN(fVar9)) {
          __assert_fail("!astc::isnan(ei.weight_error_scale[tix])",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                        ,0x254,
                        "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
                       );
        }
      }
      uVar14 = uVar14 + 1;
      pauVar13 = pauVar13 + 1;
    } while( true );
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0x212,
                "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
               );
}

Assistant:

void compute_ideal_colors_and_weights_1plane(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei
) {
	bool uses_alpha = !blk.is_constant_channel(3);

	if (uses_alpha)
	{
		compute_ideal_colors_and_weights_4_comp(blk, pi, ei);
	}
	else
	{
		compute_ideal_colors_and_weights_3_comp(blk, pi, ei, 3);
	}
}